

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoSift.c
# Opt level: O1

void reoReorderSift(reo_man *p)

{
  ulong uVar1;
  reo_plane *prVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  double *pdVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int lev0;
  ulong uVar13;
  double dVar14;
  double local_50;
  double local_48;
  double local_40;
  
  if (p->nSupp < 1) {
    __assert_fail("p->nSupp > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/reo/reoSift.c"
                  ,0x37,"void reoReorderSift(reo_man *)");
  }
  if (p->fMinWidth == 0) {
    if (p->fMinApl == 0) {
      local_50 = (double)p->nNodesCur;
    }
    else {
      local_50 = p->nAplCur;
    }
  }
  else {
    local_50 = (double)p->nWidthCur;
  }
  uVar4 = p->nSupp;
  if (0 < (int)uVar4) {
    local_40 = (double)((int)(local_50 * 1.15) + 1);
    iVar5 = 0;
    do {
      if ((int)uVar4 < 1) {
        uVar13 = 0xffffffff;
      }
      else {
        pdVar7 = p->pVarCosts;
        piVar6 = &p->pPlanes->statsNodes;
        uVar13 = 0xffffffff;
        uVar11 = 0;
        dVar14 = -1.0;
        do {
          pdVar7[uVar11] = 10000000.0;
          if ((((reo_plane *)(piVar6 + -1))->fSifted == 0) && (dVar14 < (double)*piVar6)) {
            uVar13 = uVar11 & 0xffffffff;
            dVar14 = (double)*piVar6;
          }
          uVar11 = uVar11 + 1;
          piVar6 = piVar6 + 0xe;
        } while (uVar4 != uVar11);
      }
      iVar8 = (int)uVar13;
      if (iVar8 == -1) {
        __assert_fail("VarCurrent != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/reo/reoSift.c"
                      ,0x5a,"void reoReorderSift(reo_man *)");
      }
      prVar2 = p->pPlanes;
      lVar10 = (long)iVar8;
      prVar2[lVar10].fSifted = 1;
      p->pVarCosts[lVar10] = local_50;
      prVar2->statsCostAbove = 0.0;
      local_48 = local_50;
      if (iVar8 < (int)uVar4 / 2) {
        if (0 < iVar8) {
          lVar12 = 0;
          do {
            *(double *)((long)&prVar2[1].statsCostAbove + lVar12) =
                 *(double *)((long)&prVar2->statsCostAbove + lVar12) +
                 *(double *)((long)&prVar2->statsCost + lVar12);
            lVar12 = lVar12 + 0x38;
          } while ((ulong)(iVar8 + 1) * 0x38 + -0x38 != lVar12);
        }
        lVar12 = (long)(int)uVar4;
        prVar2[lVar12].statsCostBelow = 0.0;
        if (iVar8 < (int)uVar4) {
          pdVar7 = &prVar2[lVar12].statsCostBelow;
          do {
            lVar12 = lVar12 + -1;
            pdVar7[-7] = *pdVar7 + pdVar7[-2];
            pdVar7 = pdVar7 + -7;
          } while (iVar8 < lVar12);
        }
        dVar14 = prVar2[lVar10].statsCostAbove + prVar2[lVar10].statsCost +
                 prVar2[lVar10].statsCostBelow;
        if ((local_50 != dVar14) || (NAN(local_50) || NAN(dVar14))) {
          __assert_fail("CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + p->pPlanes[VarCurrent].statsCost + p->pPlanes[VarCurrent].statsCostBelow"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/reo/reoSift.c"
                        ,0x76,"void reoReorderSift(reo_man *)");
        }
        uVar11 = uVar13;
        if (0 < iVar8) {
          lVar10 = uVar13 * 7 + -3;
          do {
            dVar14 = reoReorderSwapAdjacentVars(p,(int)(uVar13 - 1),1);
            local_50 = local_50 - dVar14;
            p->pVarCosts[uVar13 - 1] = local_50;
            prVar2 = p->pPlanes;
            *(double *)(&prVar2->statsWidth + lVar10 * 2) =
                 *(double *)(&prVar2[1].statsWidth + lVar10 * 2) + (double)(&prVar2->pHead)[lVar10];
            if ((local_40 <= local_50) ||
               (local_48 <=
                (*(double *)(&prVar2->fSifted + lVar10 * 2) +
                *(double *)(&prVar2->fSifted + lVar10 * 2)) / 3.0 +
                *(double *)(&prVar2->statsWidth + lVar10 * 2))) goto LAB_00824b3d;
            if (local_50 < local_48) {
              dVar14 = (double)((int)(local_50 * 1.15) + 1);
              if (local_40 <= dVar14) {
                dVar14 = local_40;
              }
              uVar11 = (ulong)((int)uVar13 - 1);
              local_48 = local_50;
              local_40 = dVar14;
            }
            if (((p->fMinWidth != 0) || (p->fMinApl != 0)) &&
               (p->nNodesMaxAlloc * 2 <= p->nNodesCur)) {
              reoResizeStructures(p,0,p->nNodesCur,0);
            }
            lVar10 = lVar10 + -7;
            bVar3 = 1 < (long)uVar13;
            uVar13 = uVar13 - 1;
          } while (bVar3);
          uVar13 = 0;
        }
LAB_00824b3d:
        iVar9 = (int)uVar11;
        iVar8 = (int)uVar13 + -1;
        if ((int)uVar13 == 0) {
          iVar8 = 0;
        }
        if (iVar8 < p->nSupp + -1) {
          lVar10 = (long)iVar8;
          lVar12 = lVar10 * 7 + 0xc;
          do {
            lev0 = iVar8;
            iVar9 = (int)uVar11;
            lVar10 = lVar10 + 1;
            dVar14 = reoReorderSwapAdjacentVars(p,lev0,0);
            local_50 = local_50 - dVar14;
            dVar14 = p->pVarCosts[lVar10];
            if (((dVar14 != 10000000.0) || (NAN(dVar14))) && (1e-07 < ABS(dVar14 - local_50))) {
              puts("reoReorderSift(): Error! On the backward move, the costs are different.");
            }
            p->pVarCosts[lVar10] = local_50;
            prVar2 = p->pPlanes;
            *(double *)((long)prVar2 + lVar12 * 8 + -8) =
                 *(double *)((long)prVar2 + lVar12 * 8 + -0x40) +
                 *(double *)((long)prVar2 + lVar12 * 8 + -0x48);
            if ((iVar9 <= lVar10) &&
               ((local_40 <= local_50 ||
                (local_48 <=
                 (*(double *)(&prVar2->fSifted + lVar12 * 2) +
                 *(double *)(&prVar2->fSifted + lVar12 * 2)) / 3.0 +
                 *(double *)((long)prVar2 + lVar12 * 8 + -8))))) break;
            if (local_50 <= local_48) {
              dVar14 = (double)((int)(local_50 * 1.15) + 1);
              if (local_40 <= dVar14) {
                dVar14 = local_40;
              }
              uVar11 = (ulong)(lev0 + 1);
              local_48 = local_50;
              local_40 = dVar14;
            }
            iVar9 = (int)uVar11;
            if (((p->fMinWidth != 0) || (p->fMinApl != 0)) &&
               (p->nNodesMaxAlloc * 2 <= p->nNodesCur)) {
              reoResizeStructures(p,0,p->nNodesCur,0);
            }
            lVar12 = lVar12 + 7;
            iVar8 = lev0 + 1;
          } while (lVar10 < (long)p->nSupp + -1);
          iVar8 = lev0 + 1;
        }
        if (iVar8 < iVar9) {
          __assert_fail("q >= BestQ",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/reo/reoSift.c"
                        ,0xcb,"void reoReorderSift(reo_man *)");
        }
        if (iVar9 < iVar8) {
          lVar10 = (long)iVar8;
          do {
            iVar8 = iVar8 + -1;
            dVar14 = reoReorderSwapAdjacentVars(p,iVar8,1);
            local_50 = local_50 - dVar14;
            if (1e-07 < ABS(p->pVarCosts[lVar10 + -1] - local_50)) {
              puts("reoReorderSift():  Error! On the return move, the costs are different.");
              fflush(_stdout);
            }
            lVar10 = lVar10 + -1;
          } while (iVar9 < lVar10);
        }
      }
      else {
        if (0 < iVar8) {
          lVar12 = 0;
          do {
            *(double *)((long)&prVar2[1].statsCostAbove + lVar12) =
                 *(double *)((long)&prVar2->statsCostAbove + lVar12) +
                 *(double *)((long)&prVar2->statsCost + lVar12);
            lVar12 = lVar12 + 0x38;
          } while ((ulong)(iVar8 + 1) * 0x38 + -0x38 != lVar12);
        }
        lVar12 = (long)(int)uVar4;
        prVar2[lVar12].statsCostBelow = 0.0;
        if (iVar8 < (int)uVar4) {
          pdVar7 = &prVar2[lVar12].statsCostBelow;
          do {
            lVar12 = lVar12 + -1;
            pdVar7[-7] = *pdVar7 + pdVar7[-2];
            pdVar7 = pdVar7 + -7;
          } while (iVar8 < lVar12);
        }
        dVar14 = prVar2[lVar10].statsCostAbove + prVar2[lVar10].statsCost +
                 prVar2[lVar10].statsCostBelow;
        if ((local_50 != dVar14) || (NAN(local_50) || NAN(dVar14))) {
          __assert_fail("CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + p->pPlanes[VarCurrent].statsCost + p->pPlanes[VarCurrent].statsCostBelow"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/reo/reoSift.c"
                        ,0xe4,"void reoReorderSift(reo_man *)");
        }
        uVar11 = uVar13;
        if (iVar8 < p->nSupp + -1) {
          lVar12 = lVar10 * 7 + 0xc;
          do {
            iVar8 = (int)lVar10;
            dVar14 = reoReorderSwapAdjacentVars(p,iVar8,0);
            local_50 = local_50 - dVar14;
            p->pVarCosts[lVar10 + 1] = local_50;
            prVar2 = p->pPlanes;
            *(double *)((long)prVar2 + lVar12 * 8 + -8) =
                 *(double *)((long)prVar2 + lVar12 * 8 + -0x40) +
                 *(double *)((long)prVar2 + lVar12 * 8 + -0x48);
            uVar11 = uVar13;
            if ((local_40 <= local_50) ||
               (local_48 <=
                (*(double *)(&prVar2->fSifted + lVar12 * 2) +
                *(double *)(&prVar2->fSifted + lVar12 * 2)) / 3.0 +
                *(double *)((long)prVar2 + lVar12 * 8 + -8))) break;
            if (local_50 < local_48) {
              dVar14 = (double)((int)(local_50 * 1.15) + 1);
              if (local_40 <= dVar14) {
                dVar14 = local_40;
              }
              uVar13 = (ulong)(iVar8 + 1);
              local_48 = local_50;
              local_40 = dVar14;
            }
            if (((p->fMinWidth != 0) || (p->fMinApl != 0)) &&
               (p->nNodesMaxAlloc * 2 <= p->nNodesCur)) {
              reoResizeStructures(p,0,p->nNodesCur,0);
            }
            lVar10 = lVar10 + 1;
            lVar12 = lVar12 + 7;
            uVar11 = uVar13;
          } while (lVar10 < (long)p->nSupp + -1);
          uVar13 = (ulong)(iVar8 + 1);
        }
        iVar8 = (int)uVar11;
        if (0 < (int)uVar13) {
          lVar10 = uVar13 * 7 + -3;
          do {
            iVar8 = (int)uVar11;
            uVar1 = uVar13 - 1;
            dVar14 = reoReorderSwapAdjacentVars(p,(int)uVar1,1);
            local_50 = local_50 - dVar14;
            dVar14 = p->pVarCosts[uVar13 - 1];
            if (((dVar14 != 10000000.0) || (NAN(dVar14))) && (1e-07 < ABS(dVar14 - local_50))) {
              puts("reoReorderSift(): Error! On the backward move, the costs are different.");
            }
            p->pVarCosts[uVar13 - 1] = local_50;
            prVar2 = p->pPlanes;
            *(double *)(&prVar2->statsWidth + lVar10 * 2) =
                 *(double *)(&prVar2[1].statsWidth + lVar10 * 2) + (double)(&prVar2->pHead)[lVar10];
            if (((long)uVar1 <= (long)iVar8) &&
               ((local_40 <= local_50 ||
                (local_48 <=
                 (*(double *)(&prVar2->fSifted + lVar10 * 2) +
                 *(double *)(&prVar2->fSifted + lVar10 * 2)) / 3.0 +
                 *(double *)(&prVar2->statsWidth + lVar10 * 2))))) goto LAB_00824eec;
            if (local_50 <= local_48) {
              dVar14 = (double)((int)(local_50 * 1.15) + 1);
              if (local_40 <= dVar14) {
                dVar14 = local_40;
              }
              uVar11 = (ulong)((int)uVar13 - 1);
              local_48 = local_50;
              local_40 = dVar14;
            }
            iVar8 = (int)uVar11;
            if (((p->fMinWidth != 0) || (p->fMinApl != 0)) &&
               (p->nNodesMaxAlloc * 2 <= p->nNodesCur)) {
              reoResizeStructures(p,0,p->nNodesCur,0);
            }
            lVar10 = lVar10 + -7;
            bVar3 = 1 < (long)uVar13;
            uVar13 = uVar1;
          } while (bVar3);
          uVar13 = 0;
        }
LAB_00824eec:
        iVar9 = (int)uVar13 + -1;
        if ((int)uVar13 == 0) {
          iVar9 = 0;
        }
        if (iVar8 < iVar9) {
          __assert_fail("q <= BestQ",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/reo/reoSift.c"
                        ,0x139,"void reoReorderSift(reo_man *)");
        }
        if (iVar9 < iVar8) {
          lVar10 = (long)iVar9;
          do {
            dVar14 = reoReorderSwapAdjacentVars(p,(int)lVar10,0);
            local_50 = local_50 - dVar14;
            if (1e-07 < ABS(p->pVarCosts[lVar10 + 1] - local_50)) {
              puts("reoReorderSift(): Error! On the return move, the costs are different.");
              fflush(_stdout);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < iVar8);
        }
      }
      if (1e-07 <= ABS(local_48 - local_50)) {
        __assert_fail("fabs( CostBest - CostCurrent ) < REO_COST_EPSILON",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/reo/reoSift.c"
                      ,0x145,"void reoReorderSift(reo_man *)");
      }
      if (p->fMinWidth == 0) {
        if (p->fMinApl == 0) {
          p->nNodesCur = (int)local_48;
        }
        else {
          p->nAplCur = local_50;
        }
      }
      else {
        p->nWidthCur = (int)local_48;
      }
      iVar5 = iVar5 + 1;
      uVar4 = p->nSupp;
    } while (iVar5 < (int)uVar4);
  }
  if (0 < (int)uVar4) {
    prVar2 = p->pPlanes;
    lVar10 = 0;
    do {
      *(undefined4 *)((long)&prVar2->fSifted + lVar10) = 0;
      lVar10 = lVar10 + 0x38;
    } while ((ulong)uVar4 * 0x38 - lVar10 != 0);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                    FUNCTION DEFINITIONS                          ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Implements the variable sifting algorithm.]

  Description [Performs a sequence of adjacent variable swaps known as "sifting".
  Uses the cost functions determined by the flag.]

  SideEffects []

  SeeAlso     []

***********************************************************************/
void reoReorderSift( reo_man * p )
{
    double CostCurrent;  // the cost of the current permutation
    double CostLimit;    // the maximum increase in cost that can be tolerated
    double CostBest;     // the best cost
    int BestQ;           // the best position
    int VarCurrent;      // the current variable to move   
    int q;               // denotes the current position of the variable
    int c;               // performs the loops over variables until all of them are sifted
    int v;               // used for other purposes

    assert( p->nSupp > 0 );

    // set the current cost depending on the minimization criteria
    if ( p->fMinWidth )
        CostCurrent = p->nWidthCur;
    else if ( p->fMinApl )
        CostCurrent = p->nAplCur;
    else
        CostCurrent = p->nNodesCur;

    // find the upper bound on tbe cost growth
    CostLimit = 1 + (int)(REO_REORDER_LIMIT * CostCurrent);

    // perform sifting for each of p->nSupp variables
    for ( c = 0; c < p->nSupp; c++ )
    {
        // select the current variable to be the one with the largest number of nodes that is not sifted yet
        VarCurrent = -1;
        CostBest   = -1.0;
        for ( v = 0; v < p->nSupp; v++ )
        {
            p->pVarCosts[v] = REO_HIGH_VALUE;
            if ( !p->pPlanes[v].fSifted )
            {
//                VarCurrent = v;
//                if ( CostBest < p->pPlanes[v].statsCost )
                if ( CostBest < p->pPlanes[v].statsNodes )
                {
//                    CostBest   = p->pPlanes[v].statsCost;
                    CostBest   = p->pPlanes[v].statsNodes;
                    VarCurrent = v;
                }

            }
        }
        assert( VarCurrent != -1 );
        // mark this variable as sifted
        p->pPlanes[VarCurrent].fSifted = 1;

        // set the current value
        p->pVarCosts[VarCurrent] = CostCurrent;

        // set the best cost
        CostBest = CostCurrent;
        BestQ    = VarCurrent; 

        // determine which way to move the variable first (up or down)
        // the rationale is that if we move the shorter way first
        // it is more likely that the best position will be found on the longer way
        // and the reverse movement (to take the best position) will be faster
        if ( VarCurrent < p->nSupp/2 ) // move up first, then down
        {
            // set the total cost on all levels above the current level
            p->pPlanes[0].statsCostAbove = 0;
            for ( v = 1; v <= VarCurrent; v++ )
                p->pPlanes[v].statsCostAbove = p->pPlanes[v-1].statsCostAbove + p->pPlanes[v-1].statsCost;
            // set the total cost on all levels below the current level
            p->pPlanes[p->nSupp].statsCostBelow = 0;
            for ( v = p->nSupp - 1; v >= VarCurrent; v-- )
                p->pPlanes[v].statsCostBelow = p->pPlanes[v+1].statsCostBelow + p->pPlanes[v+1].statsCost;

            assert( CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + 
                                    p->pPlanes[VarCurrent].statsCost +
                                    p->pPlanes[VarCurrent].statsCostBelow );

            // move up
            for ( q = VarCurrent-1; q >= 0; q-- )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q, 1 );
                // now q points to the position of this var in the order
                p->pVarCosts[q] = CostCurrent;
                // update the lower bound (assuming that for level q+1 it is set correctly)
                p->pPlanes[q].statsCostBelow = p->pPlanes[q+1].statsCostBelow + p->pPlanes[q+1].statsCost;
                // check the upper bound
                if ( CostCurrent >= CostLimit )
                    break;
                // check the lower bound
                if ( p->pPlanes[q].statsCostBelow + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostAbove/REO_QUAL_PAR >= CostBest )
                    break;
                // update the best cost
                if ( CostBest > CostCurrent )
                {
                    CostBest = CostCurrent;
                    BestQ    = q;
                    // adjust node limit
                    CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
                }

                // when we are reordering for width or APL, it may happen that
                // the number of nodes has grown above certain limit,
                // in which case we have to resize the data structures
                if ( p->fMinWidth || p->fMinApl )
                {
                    if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
                    {
//                        printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
                        reoResizeStructures( p, 0, p->nNodesCur, 0 );
                    }
                }
            }
            // fix the plane index
            if ( q == -1 )
                q++;
            // now p points to the position of this var in the order

            // move down
            for ( ; q < p->nSupp-1; )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q, 0 );
                q++;    // change q to point to the position of this var in the order
                // sanity check: the number of nodes on the back pass should be the same
                if ( p->pVarCosts[q] != REO_HIGH_VALUE && fabs( p->pVarCosts[q] - CostCurrent ) > REO_COST_EPSILON )
                    printf("reoReorderSift(): Error! On the backward move, the costs are different.\n");
                p->pVarCosts[q] = CostCurrent;
                // update the lower bound (assuming that for level q-1 it is set correctly)
                p->pPlanes[q].statsCostAbove = p->pPlanes[q-1].statsCostAbove + p->pPlanes[q-1].statsCost;
                // check the bounds only if the variable already reached its previous position
                if ( q >= BestQ )
                {
                    // check the upper bound
                    if ( CostCurrent >= CostLimit )
                        break;
                    // check the lower bound
                    if ( p->pPlanes[q].statsCostAbove + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostBelow/REO_QUAL_PAR >= CostBest )
                        break;
                }
                // update the best cost
                if ( CostBest >= CostCurrent )
                {
                    CostBest = CostCurrent;
                    BestQ    = q;
                    // adjust node limit
                    CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
                }

                // when we are reordering for width or APL, it may happen that
                // the number of nodes has grown above certain limit,
                // in which case we have to resize the data structures
                if ( p->fMinWidth || p->fMinApl )
                {
                    if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
                    {
//                        printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
                        reoResizeStructures( p, 0, p->nNodesCur, 0 );
                    }
                }
            }
            // move the variable up from the given position (q) to the best position (BestQ)
            assert( q >= BestQ );
            for ( ; q > BestQ; q-- )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q-1, 1 );
                // sanity check: the number of nodes on the back pass should be the same
                if ( fabs( p->pVarCosts[q-1] - CostCurrent ) > REO_COST_EPSILON )
                {
                    printf("reoReorderSift():  Error! On the return move, the costs are different.\n" );
                    fflush(stdout);
                }
            }
        }
        else // move down first, then up
        {
            // set the current number of nodes on all levels above the given level
            p->pPlanes[0].statsCostAbove = 0;
            for ( v = 1; v <= VarCurrent; v++ )
                p->pPlanes[v].statsCostAbove = p->pPlanes[v-1].statsCostAbove + p->pPlanes[v-1].statsCost;
            // set the current number of nodes on all levels below the given level
            p->pPlanes[p->nSupp].statsCostBelow = 0;
            for ( v = p->nSupp - 1; v >= VarCurrent; v-- )
                p->pPlanes[v].statsCostBelow = p->pPlanes[v+1].statsCostBelow + p->pPlanes[v+1].statsCost;
            
            assert( CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + 
                                    p->pPlanes[VarCurrent].statsCost +
                                    p->pPlanes[VarCurrent].statsCostBelow );

            // move down
            for ( q = VarCurrent; q < p->nSupp-1; )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q, 0 );
                q++;    // change q to point to the position of this var in the order
                p->pVarCosts[q] = CostCurrent;
                // update the lower bound (assuming that for level q-1 it is set correctly)
                p->pPlanes[q].statsCostAbove = p->pPlanes[q-1].statsCostAbove + p->pPlanes[q-1].statsCost;
                // check the upper bound
                if ( CostCurrent >= CostLimit )
                    break;
                // check the lower bound
                if ( p->pPlanes[q].statsCostAbove + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostBelow/REO_QUAL_PAR >= CostBest )
                    break;
                // update the best cost
                if ( CostBest > CostCurrent )
                {
                    CostBest = CostCurrent;
                    BestQ    = q;
                    // adjust node limit
                    CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
                }

                // when we are reordering for width or APL, it may happen that
                // the number of nodes has grown above certain limit,
                // in which case we have to resize the data structures
                if ( p->fMinWidth || p->fMinApl )
                {
                    if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
                    {
//                        printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
                        reoResizeStructures( p, 0, p->nNodesCur, 0 );
                    }
                }
            }

            // move up
            for ( --q; q >= 0; q-- )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q, 1 );
                // now q points to the position of this var in the order
                // sanity check: the number of nodes on the back pass should be the same
                if ( p->pVarCosts[q] != REO_HIGH_VALUE && fabs( p->pVarCosts[q] - CostCurrent ) > REO_COST_EPSILON )
                    printf("reoReorderSift(): Error! On the backward move, the costs are different.\n");
                p->pVarCosts[q] = CostCurrent;
                // update the lower bound (assuming that for level q+1 it is set correctly)
                p->pPlanes[q].statsCostBelow = p->pPlanes[q+1].statsCostBelow + p->pPlanes[q+1].statsCost;
                // check the bounds only if the variable already reached its previous position
                if ( q <= BestQ )
                {
                    // check the upper bound
                    if ( CostCurrent >= CostLimit )
                        break;
                    // check the lower bound
                    if ( p->pPlanes[q].statsCostBelow + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostAbove/REO_QUAL_PAR >= CostBest )
                        break;
                }
                // update the best cost
                if ( CostBest >= CostCurrent )
                {
                    CostBest = CostCurrent;
                    BestQ    = q;
                    // adjust node limit
                    CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
                }

                // when we are reordering for width or APL, it may happen that
                // the number of nodes has grown above certain limit,
                // in which case we have to resize the data structures
                if ( p->fMinWidth || p->fMinApl )
                {
                    if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
                    {
//                        printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
                        reoResizeStructures( p, 0, p->nNodesCur, 0 );
                    }
                }
            }
            // fix the plane index
            if ( q == -1 )
                q++;
            // now q points to the position of this var in the order
            // move the variable down from the given position (q) to the best position (BestQ)
            assert( q <= BestQ );
            for ( ; q < BestQ; q++ )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q, 0 );
                // sanity check: the number of nodes on the back pass should be the same
                if ( fabs( p->pVarCosts[q+1] - CostCurrent ) > REO_COST_EPSILON )
                {
                    printf("reoReorderSift(): Error! On the return move, the costs are different.\n" );
                    fflush(stdout);
                }
            }
        }
        assert( fabs( CostBest - CostCurrent ) < REO_COST_EPSILON );

        // update the cost 
        if ( p->fMinWidth )
            p->nWidthCur = (int)CostBest;
        else if ( p->fMinApl )
            p->nAplCur = CostCurrent;
        else
            p->nNodesCur = (int)CostBest;
    }

    // remove the sifted attributes if any
    for ( v = 0; v < p->nSupp; v++ )
        p->pPlanes[v].fSifted = 0;
}